

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

void __thiscall llvm::yaml::Scanner::scan_ns_uri_char(Scanner *this)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  StringRef local_30;
  StringRef local_20;
  Scanner *local_10;
  Scanner *this_local;
  
  local_10 = this;
  do {
    if (this->Current == this->End) {
      return;
    }
    if (((*this->Current == '%') && (this->Current + 2 < this->End)) &&
       (bVar1 = is_ns_hex_digit(this->Current[1]), bVar1)) {
      bVar2 = is_ns_hex_digit(this->Current[2]);
      bVar1 = true;
      if (!bVar2) goto LAB_028a27dd;
    }
    else {
LAB_028a27dd:
      bVar2 = is_ns_word_char(*this->Current);
      bVar1 = true;
      if (!bVar2) {
        StringRef::StringRef(&local_20,this->Current,1);
        StringRef::StringRef(&local_30,"#;/?:@&=+$,_.!~*\'()[]");
        sVar3 = StringRef::find_first_of(&local_20,local_30,0);
        bVar1 = sVar3 != 0xffffffffffffffff;
      }
    }
    if (!bVar1) {
      return;
    }
    this->Current = this->Current + 1;
    this->Column = this->Column + 1;
  } while( true );
}

Assistant:

void Scanner::scan_ns_uri_char() {
  while (true) {
    if (Current == End)
      break;
    if ((   *Current == '%'
          && Current + 2 < End
          && is_ns_hex_digit(*(Current + 1))
          && is_ns_hex_digit(*(Current + 2)))
        || is_ns_word_char(*Current)
        || StringRef(Current, 1).find_first_of("#;/?:@&=+$,_.!~*'()[]")
          != StringRef::npos) {
      ++Current;
      ++Column;
    } else
      break;
  }
}